

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg2U(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint index)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  RegSlot local_40;
  RegSlot local_3c;
  uint local_38;
  RegSlot local_34;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = R1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8e1,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00894045;
    *puVar3 = 0;
    R1 = local_34;
  }
  CheckOp(this,op,(OpLayoutType)0xc);
  CheckOpen(this);
  if (R0 != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = index;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00894045;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
      index = local_34;
    }
    R0_00 = FunctionBody::MapRegSlot(pFVar4,R0);
    if (R1 != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 != (FunctionBody *)0x0) {
LAB_00893f73:
        R1_00 = FunctionBody::MapRegSlot(pFVar4,R1);
        bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,R0_00,R1_00,index);
        if (!bVar2) {
          bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,R1_00,index);
          if (!bVar2) {
            local_40 = R0_00;
            local_3c = R1_00;
            local_38 = index;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      local_34 = index;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
        index = local_34;
        goto LAB_00893f73;
      }
      goto LAB_00894045;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_00894045:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg2U(OpCode op, RegSlot R0, RegSlot R1, uint index)
    {
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckOp(op, OpLayoutType::Reg2U);
        CheckOpen();

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2U, op, R0, R1, index);
    }